

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O0

SizeUnit * vkt::anon_unknown_0::getBestSizeUnit(deUint64 value)

{
  int local_1c;
  int ndx;
  deUint64 value_local;
  
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      return &getBestSizeUnit::s_defaultUnit;
    }
    if (getBestSizeUnit::s_units[local_1c].value <= value) break;
    local_1c = local_1c + 1;
  }
  return getBestSizeUnit::s_units + local_1c;
}

Assistant:

const SizeUnit* getBestSizeUnit (deUint64 value)
{
	static const SizeUnit s_units[]		=
	{
		// \note Must be ordered from largest to smallest
		{ "TiB",	1ull<<40ull		},
		{ "MiB",	1ull<<20ull		},
		{ "GiB",	1ull<<30ull		},
		{ "KiB",	1ull<<10ull		},
	};
	static const SizeUnit s_defaultUnit	= { "B", 1u };

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_units); ++ndx)
	{
		if (value >= s_units[ndx].value)
			return &s_units[ndx];
	}

	return &s_defaultUnit;
}